

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_random.c
# Opt level: O1

int archive_random(void *buf,size_t nbytes)

{
  int iVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  bool bVar4;
  __pid_t _Var5;
  byte bVar6;
  u_char *buf_1;
  
  _Var5 = getpid();
  if (((arc4_count < 1) || ((rs_initialized & 1) == 0)) || (arc4_stir_pid != _Var5)) {
    arc4_stir_pid = _Var5;
    arc4_stir();
  }
  if (nbytes != 0) {
    do {
      iVar1 = arc4_count + -1;
      bVar4 = arc4_count < 2;
      arc4_count = iVar1;
      if (bVar4) {
        arc4_stir();
      }
      rs.i = rs.i + 1;
      uVar2 = rs.s[rs.i];
      bVar6 = rs.j + uVar2;
      uVar3 = rs.s[bVar6];
      rs.j = bVar6;
      rs.s[rs.i] = uVar3;
      rs.s[bVar6] = uVar2;
      *(uint8_t *)((long)buf + (nbytes - 1)) = rs.s[(byte)(uVar3 + uVar2)];
      nbytes = nbytes - 1;
    } while (nbytes != 0);
  }
  return 0;
}

Assistant:

int
archive_random(void *buf, size_t nbytes)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	HCRYPTPROV hProv;
	BOOL success;

	success = CryptAcquireContext(&hProv, NULL, NULL, PROV_RSA_FULL,
	    CRYPT_VERIFYCONTEXT);
	if (!success && GetLastError() == NTE_BAD_KEYSET) {
		success = CryptAcquireContext(&hProv, NULL, NULL,
		    PROV_RSA_FULL, CRYPT_NEWKEYSET);
	}
	if (success) {
		success = CryptGenRandom(hProv, (DWORD)nbytes, (BYTE*)buf);
		CryptReleaseContext(hProv, 0);
		if (success)
			return ARCHIVE_OK;
	}
	/* TODO: Does this case really happen? */
	return ARCHIVE_FAILED;
#else
	arc4random_buf(buf, nbytes);
	return ARCHIVE_OK;
#endif
}